

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::CeilCase::getInputValues(CeilCase *this,int numValues,void **values)

{
  pointer pSVar1;
  deUint32 dVar2;
  int iVar3;
  Float<unsigned_int,_8,_23,_127,_3U> FVar4;
  int in_ECX;
  ulong uVar5;
  ulong uVar6;
  uint numValues_00;
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_5a;
  float local_58 [8];
  deRandom local_38;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar2 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_38,dVar2 ^ 0xac23f);
  pSVar1 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)(pSVar1->varType).m_data.basic.precision;
  iVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  numValues_00 = iVar3 * numValues;
  fillRandomScalars<float>
            ((Random *)&local_38,local_58[uVar5 * 2],local_58[uVar5 * 2 + 1],*values,numValues_00,
             in_ECX);
  if (uVar5 == 1) {
    uVar6 = 0;
    uVar5 = (ulong)numValues_00;
    if ((int)numValues_00 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                (&local_5a,*(float *)((long)*values + uVar6 * 4));
      FVar4 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_5a);
      *(StorageType_conflict *)((long)*values + uVar6 * 4) = FVar4.m_value;
    }
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0], numValues*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}